

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ScaleWindow(ImGuiWindow *window,float scale)

{
  ImVec2 IVar1;
  float fVar2;
  float fVar6;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  
  IVar1 = (window->Viewport->super_ImGuiViewport).Pos;
  fVar2 = IVar1.x;
  fVar6 = IVar1.y;
  IVar3.x = (float)(int)(((window->Pos).x - fVar2) * scale + fVar2);
  IVar3.y = (float)(int)(((window->Pos).y - fVar6) * scale + fVar6);
  window->Pos = IVar3;
  IVar4.x = (float)(int)((window->Size).x * scale);
  IVar4.y = (float)(int)((window->Size).y * scale);
  window->Size = IVar4;
  IVar5.x = (float)(int)((window->SizeFull).x * scale);
  IVar5.y = (float)(int)((window->SizeFull).y * scale);
  window->SizeFull = IVar5;
  IVar1.y = (float)(int)((window->ContentSize).y * scale);
  IVar1.x = (float)(int)((window->ContentSize).x * scale);
  window->ContentSize = IVar1;
  return;
}

Assistant:

static void ScaleWindow(ImGuiWindow* window, float scale)
{
    ImVec2 origin = window->Viewport->Pos;
    window->Pos = ImFloor((window->Pos - origin) * scale + origin);
    window->Size = ImFloor(window->Size * scale);
    window->SizeFull = ImFloor(window->SizeFull * scale);
    window->ContentSize = ImFloor(window->ContentSize * scale);
}